

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

void aiDetachAllLogStreams(void)

{
  bool bVar1;
  Logger *pLVar2;
  pointer ppVar3;
  int __sig;
  __pid_t __pid;
  _Self local_30;
  _Self local_28;
  iterator it;
  Logger *logger;
  _Self *__y;
  
  pLVar2 = Assimp::DefaultLogger::get();
  if (pLVar2 != (Logger *)0x0) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
         ::begin((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                  *)Assimp::gActiveLogStreams);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
           ::end((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                  *)Assimp::gActiveLogStreams);
      __y = &local_30;
      bVar1 = std::operator!=(&local_28,__y);
      __sig = (int)__y;
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>::
               operator->(&local_28);
      (*pLVar2->_vptr_Logger[3])(pLVar2,ppVar3->second,0xf);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>::
               operator->(&local_28);
      if (ppVar3->second != (LogStream *)0x0) {
        (*ppVar3->second->_vptr_LogStream[1])();
      }
      std::_Rb_tree_iterator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>::operator++
                (&local_28);
    }
    __pid = 0x112ae18;
    std::
    map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
    ::clear((map<aiLogStream,_Assimp::LogStream_*,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
             *)Assimp::gActiveLogStreams);
    Assimp::DefaultLogger::kill(__pid,__sig);
  }
  return;
}

Assistant:

ASSIMP_API void aiDetachAllLogStreams(void)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
    Logger *logger( DefaultLogger::get() );
    if ( NULL == logger ) {
        return;
    }

    for (LogStreamMap::iterator it = gActiveLogStreams.begin(); it != gActiveLogStreams.end(); ++it) {
        logger->detatchStream( it->second );
        delete it->second;
    }
    gActiveLogStreams.clear();
    DefaultLogger::kill();

    ASSIMP_END_EXCEPTION_REGION(void);
}